

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_kdf(void)

{
  int iVar1;
  char subkey4_hex [101];
  char subkey3_hex [65];
  char subkey2_hex [33];
  char subkey1_hex [33];
  uint8_t subkey4 [50];
  uint8_t subkey3 [32];
  uint8_t subkey2 [16];
  uint8_t subkey1 [16];
  uint8_t dk [32];
  uint8_t key [32];
  char *in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe28;
  uint8_t *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  uint8_t *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  uint64_t in_stack_fffffffffffffe58;
  uint8_t *in_stack_fffffffffffffe60;
  uint8_t *in_stack_fffffffffffffe68;
  void *in_stack_fffffffffffffe70;
  undefined1 local_48 [72];
  
  memset(local_48,0,0x20);
  hydro_random_buf_deterministic
            (in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  hydro_kdf_derive_from_key
            (in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  hydro_kdf_derive_from_key
            (in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  hydro_kdf_derive_from_key
            (in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  hydro_kdf_derive_from_key
            (in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  hydro_bin2hex(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                in_stack_fffffffffffffe28);
  hydro_bin2hex(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                in_stack_fffffffffffffe28);
  hydro_bin2hex(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                in_stack_fffffffffffffe28);
  hydro_bin2hex(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                in_stack_fffffffffffffe28);
  iVar1 = streq(in_stack_fffffffffffffe18,(char *)0x102e03);
  if (iVar1 == 0) {
    __assert_fail("streq((\"af8019d3516d4ba6c80a7ea5a87e4d77\"), (subkey1_hex))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xf3,"void test_kdf(void)");
  }
  iVar1 = streq(in_stack_fffffffffffffe18,(char *)0x102e3d);
  if (iVar1 == 0) {
    __assert_fail("streq((\"af8c4cba4e1f36c293631cc7001717dd\"), (subkey2_hex))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xf4,"void test_kdf(void)");
  }
  iVar1 = streq(in_stack_fffffffffffffe18,(char *)0x102e74);
  if (iVar1 == 0) {
    __assert_fail("streq((\"ff9345489dea1e4fe59194cea8794c9b0af9380c2d18c3ab38eeef2af95c1e26\"), (subkey3_hex))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0xf5,"void test_kdf(void)");
  }
  iVar1 = streq(in_stack_fffffffffffffe18,(char *)0x102ea9);
  if (iVar1 != 0) {
    return;
  }
  __assert_fail("streq((\"a8dd79ca19d604d1487b82d76b8d4ad4138a29dfaeeb207b99b2e5904e7855555bb94a76070fa71871df6ed911\" \"661d99efec\"), (subkey4_hex))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                ,0xf9,"void test_kdf(void)");
}

Assistant:

static void
test_kdf(void)
{
    uint8_t key[hydro_kdf_KEYBYTES];
    uint8_t dk[hydro_random_SEEDBYTES];
    uint8_t subkey1[16];
    uint8_t subkey2[16];
    uint8_t subkey3[32];
    uint8_t subkey4[50];
    char    subkey1_hex[16 * 2 + 1];
    char    subkey2_hex[16 * 2 + 1];
    char    subkey3_hex[32 * 2 + 1];
    char    subkey4_hex[50 * 2 + 1];

    memset(dk, 0, sizeof dk);
    hydro_random_buf_deterministic(key, sizeof key, dk);
    hydro_kdf_derive_from_key(subkey1, sizeof subkey1, 1, ctx, key);
    hydro_kdf_derive_from_key(subkey2, sizeof subkey2, 2, ctx, key);
    hydro_kdf_derive_from_key(subkey3, sizeof subkey3, 0, ctx, key);
    hydro_kdf_derive_from_key(subkey4, sizeof subkey4, 0, ctx, key);
    hydro_bin2hex(subkey1_hex, sizeof subkey1_hex, subkey1, sizeof subkey1);
    hydro_bin2hex(subkey2_hex, sizeof subkey2_hex, subkey2, sizeof subkey2);
    hydro_bin2hex(subkey3_hex, sizeof subkey3_hex, subkey3, sizeof subkey3);
    hydro_bin2hex(subkey4_hex, sizeof subkey4_hex, subkey4, sizeof subkey4);
    assert_streq("af8019d3516d4ba6c80a7ea5a87e4d77", subkey1_hex);
    assert_streq("af8c4cba4e1f36c293631cc7001717dd", subkey2_hex);
    assert_streq("ff9345489dea1e4fe59194cea8794c9b0af9380c2d18c3ab38eeef2af95c1e26", subkey3_hex);
    assert_streq(
        "a8dd79ca19d604d1487b82d76b8d4ad4138a29dfaeeb207b99b2e5904e7855555bb94a76070fa71871df6ed911"
        "661d99efec",
        subkey4_hex);
}